

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

bool __thiscall btSingleRayCallback::process(btSingleRayCallback *this,btBroadphaseProxy *proxy)

{
  float fVar1;
  long *plVar2;
  btBroadphaseProxy *pbVar3;
  ulong uVar4;
  btCollisionShape *in_RSI;
  btCollisionObject *in_RDI;
  btTransform *unaff_retaddr;
  btCollisionObject *collisionObject;
  btCollisionObject *this_00;
  btCollisionObject *collisionObject_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar5;
  
  fVar1 = *(float *)(*(long *)&in_RDI->m_collisionFlags + 8);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this_00 = (btCollisionObject *)in_RSI->_vptr_btCollisionShape;
    plVar2 = *(long **)&in_RDI->m_collisionFlags;
    collisionObject_00 = in_RDI;
    pbVar3 = btCollisionObject::getBroadphaseHandle(this_00);
    uVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,pbVar3);
    if ((uVar4 & 1) != 0) {
      btCollisionObject::getCollisionShape(this_00);
      btCollisionObject::getWorldTransform(this_00);
      btCollisionWorld::rayTestSingle
                (unaff_retaddr,
                 (btTransform *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                 collisionObject_00,in_RSI,(btTransform *)this_00,(RayResultCallback *)in_RDI);
    }
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

virtual bool	process(const btBroadphaseProxy* proxy)
	{
		///terminate further ray tests, once the closestHitFraction reached zero
		if (m_resultCallback.m_closestHitFraction == btScalar(0.f))
			return false;

		btCollisionObject*	collisionObject = (btCollisionObject*)proxy->m_clientObject;

		//only perform raycast if filterMask matches
		if(m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) 
		{
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			//btVector3 collisionObjectAabbMin,collisionObjectAabbMax;
#if 0
#ifdef RECALCULATE_AABB
			btVector3 collisionObjectAabbMin,collisionObjectAabbMax;
			collisionObject->getCollisionShape()->getAabb(collisionObject->getWorldTransform(),collisionObjectAabbMin,collisionObjectAabbMax);
#else
			//getBroadphase()->getAabb(collisionObject->getBroadphaseHandle(),collisionObjectAabbMin,collisionObjectAabbMax);
			const btVector3& collisionObjectAabbMin = collisionObject->getBroadphaseHandle()->m_aabbMin;
			const btVector3& collisionObjectAabbMax = collisionObject->getBroadphaseHandle()->m_aabbMax;
#endif
#endif
			//btScalar hitLambda = m_resultCallback.m_closestHitFraction;
			//culling already done by broadphase
			//if (btRayAabb(m_rayFromWorld,m_rayToWorld,collisionObjectAabbMin,collisionObjectAabbMax,hitLambda,m_hitNormal))
			{
				m_world->rayTestSingle(m_rayFromTrans,m_rayToTrans,
					collisionObject,
					collisionObject->getCollisionShape(),
					collisionObject->getWorldTransform(),
					m_resultCallback);
			}
		}
		return true;
	}